

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cc
# Opt level: O1

void __thiscall yyFlexLexer::yy_push_state(yyFlexLexer *this,int _new_state)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar1 = this->yy_start_stack_depth;
  if (iVar1 <= *(int *)&(this->super_FlexLexer).field_0x1c) {
    this->yy_start_stack_depth = iVar1 + 0x19;
    __size = (long)iVar1 * 4 + 100;
    if (this->yy_start_stack == (int *)0x0) {
      piVar3 = (int *)malloc(__size);
    }
    else {
      piVar3 = (int *)realloc(this->yy_start_stack,__size);
    }
    this->yy_start_stack = piVar3;
    if (piVar3 == (int *)0x0) {
      (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
                (this,"out of memory expanding start-condition stack");
    }
  }
  iVar1 = this->yy_start;
  piVar3 = this->yy_start_stack;
  iVar2 = *(int *)&(this->super_FlexLexer).field_0x1c;
  *(int *)&(this->super_FlexLexer).field_0x1c = iVar2 + 1;
  piVar3[iVar2] = (iVar1 - (iVar1 + -1 >> 0x1f)) + -1 >> 1;
  this->yy_start = _new_state * 2 + 1;
  return;
}

Assistant:

void yyFlexLexer::yy_push_state( int _new_state )
{
    	if ( (yy_start_stack_ptr) >= (yy_start_stack_depth) )
		{
		yy_size_t new_size;

		(yy_start_stack_depth) += YY_START_STACK_INCR;
		new_size = (yy_size_t) (yy_start_stack_depth) * sizeof( int );

		if ( ! (yy_start_stack) )
			(yy_start_stack) = (int *) yyalloc( new_size  );

		else
			(yy_start_stack) = (int *) yyrealloc(
					(void *) (yy_start_stack), new_size  );

		if ( ! (yy_start_stack) )
			YY_FATAL_ERROR( "out of memory expanding start-condition stack" );
		}

	(yy_start_stack)[(yy_start_stack_ptr)++] = YY_START;

	BEGIN(_new_state);
}